

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
CNetAddr::GetAddrBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          CNetAddr *this)

{
  bool bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  uint8_t serialized [16];
  allocator_type local_39;
  allocator_type local_38 [16];
  uchar local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsAddrV1Compatible(this);
  if (bVar1) {
    SerializeV1Array(this,(uint8_t (*) [16])local_38);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (uchar *)local_38,local_28,&local_39);
  }
  else {
    uVar2 = (this->m_addr)._size;
    if (0x10 < uVar2) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      uVar2 = uVar2 - 0x11;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<16u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (const_iterator)this,(uchar *)((long)this + (long)(int)uVar2),local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> CNetAddr::GetAddrBytes() const
{
    if (IsAddrV1Compatible()) {
        uint8_t serialized[V1_SERIALIZATION_SIZE];
        SerializeV1Array(serialized);
        return {std::begin(serialized), std::end(serialized)};
    }
    return std::vector<unsigned char>(m_addr.begin(), m_addr.end());
}